

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

void Nwk_ManGraphSortPairs(Nwk_Grf_t *p)

{
  int iVar1;
  int Entry;
  Vec_Int_t *pVVar2;
  int *piVar3;
  bool bVar4;
  void *__s;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  pVVar2 = p->vPairs;
  iVar1 = pVVar2->nSize;
  iVar7 = p->nObjs;
  __s = malloc((long)(int)(iVar7 + 1U) << 2);
  if (-1 < iVar7) {
    memset(__s,0xff,(ulong)(iVar7 + 1U) << 2);
  }
  if (0 < iVar1) {
    piVar3 = pVVar2->pArray;
    lVar5 = 0;
    do {
      lVar6 = (long)piVar3[lVar5];
      if (*(int *)((long)__s + lVar6 * 4) != -1) {
        __assert_fail("pIdToPair[ p->vPairs->pArray[i] ] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                      ,0x176,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
      }
      *(int *)((long)__s + lVar6 * 4) = piVar3[lVar5 + 1];
      lVar5 = lVar5 + 2;
    } while ((int)lVar5 < iVar1);
  }
  pVVar2->nSize = 0;
  if (iVar7 < 0) {
    iVar7 = 0;
  }
  else {
    uVar8 = 0;
    do {
      Entry = *(int *)((long)__s + uVar8 * 4);
      if (-1 < (long)Entry) {
        if ((ulong)(long)Entry <= uVar8) {
          __assert_fail("i < pIdToPair[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                        ,0x17e,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
        }
        Vec_IntPush(p->vPairs,(int)uVar8);
        Vec_IntPush(p->vPairs,Entry);
        iVar7 = p->nObjs;
      }
      bVar4 = (long)uVar8 < (long)iVar7;
      uVar8 = uVar8 + 1;
    } while (bVar4);
    iVar7 = p->vPairs->nSize;
  }
  if (iVar1 == iVar7) {
    if (__s != (void *)0x0) {
      free(__s);
      return;
    }
    return;
  }
  __assert_fail("nSize == Vec_IntSize(p->vPairs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                ,0x182,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
}

Assistant:

void Nwk_ManGraphSortPairs( Nwk_Grf_t * p )
{
    int nSize = Vec_IntSize(p->vPairs);
    int * pIdToPair, i;
    // allocate storage
    pIdToPair = ABC_ALLOC( int, p->nObjs+1 );
    for ( i = 0; i <= p->nObjs; i++ )
        pIdToPair[i] = -1;
    // create mapping
    for ( i = 0; i < p->vPairs->nSize; i += 2 )
    {
        assert( pIdToPair[ p->vPairs->pArray[i] ] == -1 );
        pIdToPair[ p->vPairs->pArray[i] ] = p->vPairs->pArray[i+1];
    }
    // recreate pairs
    Vec_IntClear( p->vPairs );
    for ( i = 0; i <= p->nObjs; i++ )
        if ( pIdToPair[i] >= 0 )
        {
            assert( i < pIdToPair[i] );
            Vec_IntPush( p->vPairs, i );
            Vec_IntPush( p->vPairs, pIdToPair[i] );
        }
    assert( nSize == Vec_IntSize(p->vPairs) );
    ABC_FREE( pIdToPair );
}